

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

Image * __thiscall FFT::ComplexData::get(Image *__return_storage_ptr__,ComplexData *this)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  
  auVar10 = in_ZMM0._0_16_;
  if ((this->super_BaseComplexData<kiss_fft_cpx>)._data == (kiss_fft_cpx *)0x0) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (__return_storage_ptr__,0,0,'\x01','\x01');
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (__return_storage_ptr__,(this->super_BaseComplexData<kiss_fft_cpx>)._width,
               (this->super_BaseComplexData<kiss_fft_cpx>)._height,'\x01','\x01');
    uVar7 = (this->super_BaseComplexData<kiss_fft_cpx>)._height;
    if (uVar7 != 0) {
      uVar6 = (this->super_BaseComplexData<kiss_fft_cpx>)._width;
      puVar1 = __return_storage_ptr__->_data;
      uVar4 = uVar7 >> 1;
      uVar3 = uVar6 >> 1;
      auVar10 = vcvtusi2ss_avx512f(auVar10,uVar7 * uVar6);
      uVar5 = 0;
      do {
        uVar2 = -uVar4;
        if (uVar5 < uVar4) {
          uVar2 = uVar4;
        }
        uVar8 = 0;
        if (uVar6 != 0) {
          uVar7 = 0;
          do {
            uVar8 = -uVar3;
            if (uVar7 < uVar3) {
              uVar8 = uVar3;
            }
            iVar9 = uVar8 + uVar7;
            uVar8 = uVar5 * uVar6 + uVar7;
            uVar7 = uVar7 + 1;
            puVar1[iVar9 + uVar6 * (uVar2 + uVar5)] =
                 (uchar)(int)((this->super_BaseComplexData<kiss_fft_cpx>)._data[uVar8].r /
                              auVar10._0_4_ + 0.5);
            uVar6 = (this->super_BaseComplexData<kiss_fft_cpx>)._width;
          } while (uVar7 < uVar6);
          uVar7 = (this->super_BaseComplexData<kiss_fft_cpx>)._height;
          uVar8 = uVar6;
        }
        uVar6 = uVar8;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image ComplexData::get() const
    {
        if ( empty() )
            return PenguinV_Image::Image();

        PenguinV_Image::Image image( _width, _height, 1u, 1u );
        uint8_t * out = image.data();

        const uint32_t size = _width * _height;
        const uint32_t middleX = _width  / 2;
        const uint32_t middleY = _height / 2;

        for ( uint32_t inY = 0; inY < _height; ++inY ) {
            const uint32_t outY = (inY < middleY) ? middleY + inY : inY - middleY;

            for ( uint32_t inX = 0; inX < _width; ++inX ) {
                const uint32_t outX = (inX < middleX) ? middleX + inX : inX - middleX;
                out[outY * _width + outX] = static_cast<uint8_t>(_data[inY * _width + inX].r / static_cast<float>(size) + 0.5);
            }
        }

        return image;
    }